

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::ResetStream
          (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this,
          TokenStream<SGParser::Generator::StdGrammarToken> *psourceStream,size_t rememberLength)

{
  StreamBlock *this_00;
  size_t sVar1;
  size_t rememberLength_local;
  TokenStream<SGParser::Generator::StdGrammarToken> *psourceStream_local;
  BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this_local;
  
  std::
  map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock_*>_>_>
  ::clear(&this->Markers);
  while (this->pFirstBlock->pNext != (StreamBlock *)0x0) {
    this_00 = std::
              exchange<SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock*,SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock*&>
                        (&this->pFirstBlock,&this->pFirstBlock->pNext);
    if (this_00 != (StreamBlock *)0x0) {
      StreamBlock::~StreamBlock(this_00);
      operator_delete(this_00,0x7018);
    }
  }
  this->pThisBlock = this->pFirstBlock;
  this->pThisBlock->Index = 0;
  this->ThisPos = 0;
  this->pSourceStream = psourceStream;
  this->RememberLength = rememberLength;
  sVar1 = 0;
  if (psourceStream != (TokenStream<SGParser::Generator::StdGrammarToken> *)0x0) {
    sVar1 = 0xffffffffffffffff;
  }
  this->LengthLeft = sVar1;
  this->Pos = 0;
  this->SourceEOFFlag = false;
  return;
}

Assistant:

void BacktrackingTokenStream<Token>::ResetStream(TokenStream<Token>* psourceStream,
                                                 size_t rememberLength) noexcept {
    // Release all markers
    Markers.clear();
    // Release all but one buffer
    while (pFirstBlock->pNext)
        delete std::exchange(pFirstBlock, pFirstBlock->pNext);

    pThisBlock        = pFirstBlock;
    pThisBlock->Index = 0u;
    ThisPos           = 0u;
    // Reset variables
    pSourceStream     = psourceStream;
    RememberLength    = rememberLength;
    LengthLeft        = psourceStream ? MaxSize : 0u;
    Pos               = 0u;
    SourceEOFFlag     = false;
}